

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnStartFunction
          (BinaryReaderInterp *this,Index func_index)

{
  Result RVar1;
  Location loc;
  Location loc_1;
  Var local_78;
  
  loc.field_1.field_0.last_column = 0;
  loc.filename._M_len = (this->filename_)._M_len;
  loc.filename._M_str = (this->filename_)._M_str;
  loc.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  loc_1.field_1.field_0.last_column = 0;
  loc_1.filename._M_len = (this->filename_)._M_len;
  loc_1.filename._M_str = (this->filename_)._M_str;
  loc_1.field_1.field_1.offset = loc.field_1.field_1.offset;
  Var::Var(&local_78,func_index,&loc_1);
  RVar1 = SharedValidator::OnStart(&this->validator_,&loc,&local_78);
  Var::~Var(&local_78);
  if (RVar1.enum_ != Error) {
    loc.filename._M_len = CONCAT44(loc.filename._M_len._4_4_,func_index);
    std::vector<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>::
    emplace_back<wabt::interp::StartDesc>(&this->module_->starts,(StartDesc *)&loc);
  }
  return (Result)(uint)(RVar1.enum_ == Error);
}

Assistant:

Result BinaryReaderInterp::OnStartFunction(Index func_index) {
  CHECK_RESULT(
      validator_.OnStart(GetLocation(), Var(func_index, GetLocation())));
  module_.starts.push_back(StartDesc{func_index});
  return Result::Ok;
}